

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<long_(const_void_*,_long)>::~TypedExpectation
          (TypedExpectation<long_(const_void_*,_long)> *this)

{
  linked_ptr<testing::ActionInterface<long_(const_void_*,_long)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001b2028;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<long_(const_void_*,_long)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<long_(const_void_*,_long)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<long_(const_void_*,_long)>_>::~linked_ptr(this_00);
      operator_delete(this_00);
    }
  }
  linked_ptr<testing::ActionInterface<long_(const_void_*,_long)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001b1af0;
  linked_ptr<const_testing::MatcherInterface<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>_>
  ::~linked_ptr(&(this->extra_matcher_).
                 super_MatcherBase<const_std::tr1::tuple<const_void_*,_long,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                 .impl_);
  (this->matchers_).f1_.super_MatcherBase<long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b1ad0;
  linked_ptr<const_testing::MatcherInterface<long>_>::~linked_ptr
            (&(this->matchers_).f1_.super_MatcherBase<long>.impl_);
  (this->matchers_).f0_.super_MatcherBase<const_void_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b1a68;
  linked_ptr<const_testing::MatcherInterface<const_void_*>_>::~linked_ptr
            (&(this->matchers_).f0_.super_MatcherBase<const_void_*>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }